

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::udp_tracker_connection::fail
          (udp_tracker_connection *this,error_code *ec,operation_t op,char *msg,seconds32 interval,
          seconds32 min_interval)

{
  basic_endpoint<boost::asio::ip::tcp> *__src;
  pointer *ppbVar1;
  endpoint *this_00;
  mutex *pmVar2;
  ushort uVar3;
  int read_timeout;
  pointer pbVar4;
  pointer pbVar5;
  basic_endpoint<boost::asio::ip::tcp> *pbVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  pointer pcVar8;
  session_settings *psVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  char cVar12;
  __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
  __dest;
  ulong uVar13;
  endpoint *ep;
  endpoint *ep_00;
  int completion_timeout;
  shared_ptr<libtorrent::aux::request_callback> cb;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_a0 [2];
  seconds32 local_80;
  seconds32 local_7c;
  error_code *local_78;
  undefined1 local_70 [24];
  duration dStack_58;
  undefined1 local_50 [32];
  
  pbVar4 = (this->m_endpoints).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (this->m_endpoints).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_target).impl_.data_.base.sa_family == 2) {
    local_b0._0_8_ = (ulong)(this->m_target).impl_.data_.v6.sin6_flowinfo << 0x20;
    local_b0._8_8_ = 0;
    aaStack_a0[0]._M_allocated_capacity = 0;
    aaStack_a0[0]._8_8_ = 0;
  }
  else {
    local_b0._8_8_ = *(undefined8 *)((long)&(this->m_target).impl_.data_ + 8);
    aaStack_a0[0]._0_8_ = *(size_type *)((long)&(this->m_target).impl_.data_ + 0x10);
    aaStack_a0[0]._8_8_ = ZEXT48((this->m_target).impl_.data_.v6.sin6_scope_id);
    local_b0._0_8_ = (anon_struct_8_0_00000001_for___align)0x1;
  }
  uVar3 = (this->m_target).impl_.data_.v4.sin_port;
  local_80.__r = interval.__r;
  local_7c.__r = min_interval.__r;
  local_78 = ec;
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            ((basic_endpoint<boost::asio::ip::tcp> *)local_50,(address *)local_b0,
             uVar3 << 8 | uVar3 >> 8);
  __dest = ::std::
           __find_if<__gnu_cxx::__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>*,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const>>
                     (pbVar4,pbVar5,(basic_endpoint<boost::asio::ip::tcp> *)local_50);
  pbVar6 = (this->m_endpoints).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__dest._M_current != pbVar6) {
    __src = __dest._M_current + 1;
    if ((__src != pbVar6) && (0 < (long)pbVar6 - (long)__src)) {
      uVar13 = (ulong)((long)pbVar6 - (long)__src) / 0x1c;
      if (uVar13 < 2) {
        uVar13 = 1;
      }
      memmove(__dest._M_current,__src,uVar13 * 0x1c);
    }
    ppbVar1 = &(this->m_endpoints).
               super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppbVar1 = *ppbVar1 + -1;
  }
  if ((((this->m_endpoints).
        super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->m_endpoints).
        super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) ||
      (p_Var7 = (this->super_tracker_connection).m_req.outgoing_socket.m_sock.
                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi, p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
     || (p_Var7->_M_use_count == 0)) {
    tracker_connection::fail(&this->super_tracker_connection,local_78,op,msg,local_80,local_7c);
  }
  else {
    this_00 = &this->m_target;
    tracker_connection::requester((tracker_connection *)local_70);
    if ((_func_int **)local_70._0_8_ != (_func_int **)0x0) {
      cVar12 = (**(code **)(*(_func_int **)local_70._0_8_ + 0x30))();
      uVar11 = local_70._0_8_;
      if (cVar12 != '\0') {
        pcVar8 = (this->m_hostname)._M_dataplus._M_p;
        print_endpoint_abi_cxx11_((string *)local_b0,(aux *)this_00,ep);
        uVar10 = local_b0._0_8_;
        (*local_78->cat_->_vptr_error_category[4])
                  (local_50,local_78->cat_,(ulong)(uint)local_78->val_);
        (**(code **)(*(_func_int **)uVar11 + 0x38))
                  (uVar11,"*** UDP_TRACKER [ host: \"%s\" ip: \"%s\" | ERROR: \"%s\" ]",pcVar8,
                   uVar10,local_50._0_8_);
        if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
          operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._0_8_ != aaStack_a0) {
          operator_delete((void *)local_b0._0_8_,aaStack_a0[0]._M_allocated_capacity + 1);
        }
      }
    }
    pbVar4 = (this->m_endpoints).
             super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pbVar4->impl_).data_.base.sa_family == 2) {
      local_b0._0_8_ = (ulong)(pbVar4->impl_).data_.v6.sin6_flowinfo << 0x20;
      local_b0._8_8_ = 0;
      aaStack_a0[0]._M_allocated_capacity = (undefined8 *)0x0;
      aaStack_a0[0]._8_8_ = 0;
    }
    else {
      local_b0._8_8_ = *(undefined8 *)((long)&(pbVar4->impl_).data_ + 8);
      aaStack_a0[0]._0_8_ = *(undefined8 *)((long)&(pbVar4->impl_).data_ + 0x10);
      aaStack_a0[0]._8_8_ = ZEXT48((pbVar4->impl_).data_.v6.sin6_scope_id);
      local_b0._0_8_ = (anon_struct_8_0_00000001_for___align)0x1;
    }
    uVar3 = (pbVar4->impl_).data_.v4.sin_port;
    boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
              ((basic_endpoint<boost::asio::ip::udp> *)local_50,(address *)local_b0,
               uVar3 << 8 | uVar3 >> 8);
    *(undefined4 *)((long)&(this->m_target).impl_.data_ + 0xc) = local_50._12_4_;
    *(undefined4 *)((long)&(this->m_target).impl_.data_ + 0x10) = local_50._16_4_;
    *(undefined4 *)((long)&(this->m_target).impl_.data_ + 0x14) = local_50._20_4_;
    (this->m_target).impl_.data_.v6.sin6_scope_id = local_50._24_4_;
    *(undefined4 *)&(this_00->impl_).data_ = local_50._0_4_;
    (this->m_target).impl_.data_.v4.sin_addr.s_addr = local_50._4_4_;
    *(undefined4 *)((long)&(this->m_target).impl_.data_ + 8) = local_50._8_4_;
    *(undefined4 *)((long)&(this->m_target).impl_.data_ + 0xc) = local_50._12_4_;
    if ((_func_int **)local_70._0_8_ != (_func_int **)0x0) {
      cVar12 = (**(code **)(*(_func_int **)local_70._0_8_ + 0x30))();
      if (cVar12 != '\0') {
        pcVar8 = (this->m_hostname)._M_dataplus._M_p;
        print_endpoint_abi_cxx11_((string *)local_b0,(aux *)this_00,ep_00);
        (**(code **)(*(_func_int **)local_70._0_8_ + 0x38))
                  (local_70._0_8_,"*** UDP_TRACKER trying next IP [ host: \"%s\" ip: \"%s\" ]",
                   pcVar8,local_b0._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._0_8_ != aaStack_a0) {
          operator_delete((void *)local_b0._0_8_,aaStack_a0[0]._M_allocated_capacity + 1);
        }
      }
    }
    boost::asio::execution::
    any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>
    ::any_executor((any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>
                    *)local_b0,
                   &(this->super_tracker_connection).super_timeout_handler.m_timeout.impl_.executor_
                  );
    shared_from_this((udp_tracker_connection *)(local_70 + 0x10));
    local_50._0_8_ = start_announce;
    local_50[8] = '\0';
    local_50[9] = '\0';
    local_50[10] = '\0';
    local_50[0xb] = '\0';
    local_50[0xc] = '\0';
    local_50[0xd] = '\0';
    local_50[0xe] = '\0';
    local_50[0xf] = '\0';
    local_50._16_8_ = local_70._16_8_;
    local_50._24_8_ = dStack_58.__r;
    local_70._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    dStack_58.__r = 0;
    boost::asio::
    post<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,std::_Bind<void(libtorrent::aux::udp_tracker_connection::*(std::shared_ptr<libtorrent::aux::udp_tracker_connection>))()>>
              ((any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>
                *)local_b0,
               (_Bind<void_(libtorrent::aux::udp_tracker_connection::*(std::shared_ptr<libtorrent::aux::udp_tracker_connection>))()>
                *)local_50,(type *)0x0);
    if (local_50._24_8_ != 0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._24_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dStack_58.__r !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dStack_58.__r);
    }
    (**(code **)aaStack_a0[0]._0_8_)();
    psVar9 = ((this->super_tracker_connection).m_man)->m_settings;
    pmVar2 = &psVar9->m_mutex;
    local_b0._0_8_ = pmVar2;
    if ((this->super_tracker_connection).m_req.event == stopped) {
      local_b0._8_8_ = (ulong)(uint7)local_b0._9_7_ << 8;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_b0);
      completion_timeout = (psVar9->m_store).m_ints._M_elems[2];
    }
    else {
      local_b0._8_8_ = (ulong)(uint7)local_b0._9_7_ << 8;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_b0);
      completion_timeout = (psVar9->m_store).m_ints._M_elems[0];
    }
    local_b0[8] = '\x01';
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b0);
    local_b0[8] = '\0';
    local_b0._0_8_ = pmVar2;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_b0);
    local_b0[8] = 1;
    read_timeout = (psVar9->m_store).m_ints._M_elems[1];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b0);
    timeout_handler::set_timeout((timeout_handler *)this,completion_timeout,read_timeout);
    if ((element_type *)local_70._8_8_ != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
    }
  }
  return;
}

Assistant:

void udp_tracker_connection::fail(error_code const& ec, operation_t const op
		, char const* msg, seconds32 const interval, seconds32 const min_interval)
	{
		// m_target failed. remove it from the endpoint list
		auto const i = std::find(m_endpoints.begin()
			, m_endpoints.end(), make_tcp(m_target));

		if (i != m_endpoints.end()) m_endpoints.erase(i);

		// if that was the last one, or the listen socket was closed
		// fail the whole announce
		if (m_endpoints.empty() || !tracker_req().outgoing_socket)
		{
			tracker_connection::fail(ec, op, msg, interval, min_interval);
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		std::shared_ptr<request_callback> cb = requester();
		if (cb && cb->should_log())
		{
			cb->debug_log(R"(*** UDP_TRACKER [ host: "%s" ip: "%s" | ERROR: "%s" ])"
				, m_hostname.c_str(), print_endpoint(m_target).c_str(), ec.message().c_str());
		}
#endif

		// pick another target endpoint and try again
		m_target = make_udp(m_endpoints.front());

#ifndef TORRENT_DISABLE_LOGGING
		if (cb && cb->should_log())
		{
			cb->debug_log(R"(*** UDP_TRACKER trying next IP [ host: "%s" ip: "%s" ])"
				, m_hostname.c_str(), print_endpoint(m_target).c_str());
		}
#endif
		post(get_executor(), std::bind(
			&udp_tracker_connection::start_announce, shared_from_this()));

		aux::session_settings const& settings = m_man.settings();
		set_timeout(tracker_req().event == event_t::stopped
			? settings.get_int(settings_pack::stop_tracker_timeout)
			: settings.get_int(settings_pack::tracker_completion_timeout)
			, settings.get_int(settings_pack::tracker_receive_timeout));
	}